

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

float * Abc_NtkGetCiArrivalFloats(Abc_Ntk_t *pNtk)

{
  float *pfVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  long lVar3;
  float fVar4;
  
  iVar2 = pNtk->vCis->nSize;
  pfVar1 = (float *)calloc((long)iVar2,4);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      pNode = Abc_NtkCi(pNtk,(int)lVar3);
      fVar4 = Abc_NodeReadArrivalWorst(pNode);
      pfVar1[lVar3] = fVar4;
      iVar2 = pNtk->vCis->nSize;
    }
  }
  return pfVar1;
}

Assistant:

float * Abc_NtkGetCiArrivalFloats( Abc_Ntk_t * pNtk )
{
    float * p;
    Abc_Obj_t * pNode;
    int i;
    p = ABC_CALLOC( float, Abc_NtkCiNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        return p;
    // set the PI arrival times
    Abc_NtkForEachCi( pNtk, pNode, i )
        p[i] = Abc_NodeReadArrivalWorst(pNode);
    return p;
}